

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::ruby::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,FieldDescriptor *field)

{
  Type TVar1;
  char *__s;
  allocator<char> local_9;
  
  TVar1 = FieldDescriptor::type((FieldDescriptor *)this);
  switch(TVar1) {
  case TYPE_DOUBLE:
    __s = "double";
    break;
  case TYPE_FLOAT:
    __s = "float";
    break;
  case TYPE_INT64:
    __s = "int64";
    break;
  case TYPE_UINT64:
    __s = "uint64";
    break;
  case TYPE_INT32:
    __s = "int32";
    break;
  case TYPE_FIXED64:
    __s = "fixed64";
    break;
  case TYPE_FIXED32:
    __s = "fixed32";
    break;
  case TYPE_BOOL:
    __s = "bool";
    break;
  case TYPE_STRING:
    __s = "string";
    break;
  case TYPE_GROUP:
    __s = "group";
    break;
  case TYPE_MESSAGE:
    __s = "message";
    break;
  case TYPE_BYTES:
    __s = "bytes";
    break;
  case TYPE_UINT32:
    __s = "uint32";
    break;
  case TYPE_ENUM:
    __s = "enum";
    break;
  case TYPE_SFIXED32:
    __s = "sfixed32";
    break;
  case TYPE_SFIXED64:
    __s = "sfixed64";
    break;
  case TYPE_SINT32:
    __s = "sint32";
    break;
  case MAX_TYPE:
    __s = "sint64";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                  ,0x6f,
                  "std::string google::protobuf::compiler::ruby::TypeName(const google::protobuf::FieldDescriptor *)"
                 );
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeName(const google::protobuf::FieldDescriptor* field) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32: return "int32";
    case FieldDescriptor::TYPE_INT64: return "int64";
    case FieldDescriptor::TYPE_UINT32: return "uint32";
    case FieldDescriptor::TYPE_UINT64: return "uint64";
    case FieldDescriptor::TYPE_SINT32: return "sint32";
    case FieldDescriptor::TYPE_SINT64: return "sint64";
    case FieldDescriptor::TYPE_FIXED32: return "fixed32";
    case FieldDescriptor::TYPE_FIXED64: return "fixed64";
    case FieldDescriptor::TYPE_SFIXED32: return "sfixed32";
    case FieldDescriptor::TYPE_SFIXED64: return "sfixed64";
    case FieldDescriptor::TYPE_DOUBLE: return "double";
    case FieldDescriptor::TYPE_FLOAT: return "float";
    case FieldDescriptor::TYPE_BOOL: return "bool";
    case FieldDescriptor::TYPE_ENUM: return "enum";
    case FieldDescriptor::TYPE_STRING: return "string";
    case FieldDescriptor::TYPE_BYTES: return "bytes";
    case FieldDescriptor::TYPE_MESSAGE: return "message";
    case FieldDescriptor::TYPE_GROUP: return "group";
    default: assert(false); return "";
  }
}